

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O3

void __thiscall
OptionParser::parseReportField(OptionParser *this,Network *network,int nTokens,string *tokens)

{
  string *s1;
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  int index;
  InputError *pIVar4;
  int enabled;
  int precision_00;
  double lowerLimit_00;
  double upperLimit_00;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string *local_78;
  double local_70;
  double lowerLimit;
  double upperLimit;
  int precision;
  string local_50;
  
  upperLimit._0_4_ = -1;
  local_70 = -1.0;
  lowerLimit = -1.0;
  _precision = network;
  index = Utilities::findMatch(tokens,ReportFields::NodeFieldNames);
  if (index < 0) {
    index = Utilities::findMatch(tokens,ReportFields::LinkFieldNames);
    if (index < 0) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      pcVar1 = (tokens->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar1,pcVar1 + tokens->_M_string_length);
      InputError::InputError(pIVar4,3,&local_118);
      __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
    }
    upperLimit._4_4_ = 1;
  }
  else {
    upperLimit._4_4_ = 0;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"YES","");
  s1 = tokens + 1;
  bVar3 = Utilities::match(s1,&local_50);
  local_78 = tokens;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  enabled = 1;
  precision_00 = -1;
  if (bVar3) {
LAB_00138214:
    lowerLimit_00 = -1.0;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NO","");
    bVar3 = Utilities::match(s1,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    enabled = 0;
    if (bVar3) goto LAB_00138214;
    if (nTokens < 3) {
      return;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"PRECISION","");
    bVar3 = Utilities::match(s1,&local_50);
    psVar2 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (bVar3) {
      bVar3 = Utilities::parseNumber<int>(psVar2 + 2,(int *)&upperLimit);
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        pcVar1 = psVar2[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar1,pcVar1 + psVar2[2]._M_string_length);
        InputError::InputError(pIVar4,6,&local_f8);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
      enabled = -1;
      precision_00 = upperLimit._0_4_;
      goto LAB_00138214;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BELOW","");
    bVar3 = Utilities::match(s1,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (!bVar3) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ABOVE","");
      bVar3 = Utilities::match(s1,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar1 = psVar2[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar1,pcVar1 + psVar2[1]._M_string_length);
        InputError::InputError(pIVar4,3,&local_98);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar3 = Utilities::parseNumber<double>(psVar2 + 2,&lowerLimit);
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar1 = psVar2[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar1,pcVar1 + psVar2[2]._M_string_length);
        InputError::InputError(pIVar4,6,&local_b8);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
      precision_00 = -1;
      enabled = -1;
      lowerLimit_00 = -1.0;
      upperLimit_00 = lowerLimit;
      goto LAB_0013821b;
    }
    bVar3 = Utilities::parseNumber<double>(psVar2 + 2,&local_70);
    if (!bVar3) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar1 = psVar2[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + psVar2[2]._M_string_length);
      InputError::InputError(pIVar4,6,&local_d8);
      __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
    }
    precision_00 = -1;
    enabled = -1;
    lowerLimit_00 = local_70;
  }
  upperLimit_00 = -1.0;
LAB_0013821b:
  Options::setReportFieldOption
            (&_precision->options,upperLimit._4_4_,index,enabled,precision_00,lowerLimit_00,
             upperLimit_00);
  return;
}

Assistant:

void OptionParser::parseReportField(Network* network, int nTokens, string* tokens)
{
    int    type = Element::NODE;
    int    index = -1;
    int    enabled = -1;
    int    precision = -1;
    double lowerLimit = -1;
    double upperLimit = -1;

    // ... parse FieldName  YES/NO
    index = Utilities::findMatch(tokens[0], ReportFields::NodeFieldNames);
    if ( index < 0 )
    {
        type = Element::LINK;
        index = Utilities::findMatch(tokens[0], ReportFields::LinkFieldNames);
        if ( index < 0 ) throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
    }

    if ( Utilities::match(tokens[1], "YES") ) enabled = 1;
    else if ( Utilities::match(tokens[1], "NO") ) enabled = 0;
    else if ( nTokens < 3 ) return;

    // ... parse FieldName  PRECISION  number
    else if ( Utilities::match(tokens[1], "PRECISION") )
    {
        if ( !Utilities::parseNumber(tokens[2], precision) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }

    // ... parse FieldName  ABOVE/BELOW  number
    else if ( Utilities::match(tokens[1], "BELOW") )
    {
        if ( !Utilities::parseNumber(tokens[2], lowerLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else if ( Utilities::match(tokens[1], "ABOVE") )
    {
        if ( !Utilities::parseNumber(tokens[2], upperLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    network->options.setReportFieldOption(
            type, index, enabled, precision, lowerLimit, upperLimit);
}